

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_parse_ini_file(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  jx9_value *pjVar2;
  void *zIn;
  sxu32 nByte;
  jx9_io_stream *pStream;
  void *pHandle;
  int bProcessSection;
  char *pcVar3;
  jx9_vm *pVm;
  char *zFile;
  int nLen;
  SyBlob sContents;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar3 = "Expecting a file path";
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pVm = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pVm,&zFile,nLen);
    pcVar3 = zFile;
    if (pStream != (jx9_io_stream *)0x0) {
      pHandle = jx9StreamOpenHandle(pVm,pStream,zFile,1,0,(jx9_value *)0x0,0,(int *)0x0);
      if (pHandle != (void *)0x0) {
        sContents.pAllocator = &pCtx->pVm->sAllocator;
        sContents.pBlob = (void *)0x0;
        sContents.nByte = 0;
        sContents.mByte = 0;
        sContents.nFlags = 0;
        jx9StreamReadWholeFile(pHandle,pStream,&sContents);
        zIn = sContents.pBlob;
        nByte = sContents.nByte;
        if (sContents.nByte == 0) {
          pjVar2 = pCtx->pRet;
          jx9MemObjRelease(pjVar2);
          (pjVar2->x).rVal = 0.0;
          pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
        }
        else {
          bProcessSection = 0;
          if (nArg != 1) {
            pjVar2 = apArg[1];
            jx9MemObjToBool(pjVar2);
            bProcessSection = *(int *)&pjVar2->x;
          }
          jx9ParseIniString(pCtx,(char *)zIn,nByte,bProcessSection);
        }
        if (pStream->xClose != (_func_void_void_ptr *)0x0) {
          (*pStream->xClose)(pHandle);
        }
        if ((sContents.nFlags & 6) != 0) {
          return 0;
        }
        if (sContents.mByte == 0) {
          return 0;
        }
        SyMemBackendFree(sContents.pAllocator,sContents.pBlob);
        return 0;
      }
      jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar3);
      goto LAB_0013e891;
    }
    pjVar1 = pCtx->pFunc;
    pcVar3 = "No such stream device, JX9 is returning FALSE";
  }
  jx9VmThrowError(pVm,&pjVar1->sName,2,pcVar3);
LAB_0013e891:
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).rVal = 0.0;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_parse_ini_file(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zFile;
	SyBlob sContents;
	void *pHandle;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, FALSE, 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	SyBlobInit(&sContents, &pCtx->pVm->sAllocator);
	/* Read the whole file */
	jx9StreamReadWholeFile(pHandle, pStream, &sContents);
	if( SyBlobLength(&sContents) < 1 ){
		/* Empty buffer, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Process the raw INI buffer */
		jx9ParseIniString(pCtx, (const char *)SyBlobData(&sContents), SyBlobLength(&sContents), 
			nArg > 1 ? jx9_value_to_bool(apArg[1]) : 0);
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Release the working buffer */
	SyBlobRelease(&sContents);
	return JX9_OK;
}